

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O2

void chrono::geometry::ChBasisToolsBspline::BasisEvaluate
               (int p,int i,double u,ChVectorDynamic<> *knotU,ChVectorDynamic<> *N)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  double *pdVar4;
  void *pvVar5;
  CoeffReturnType pdVar6;
  ulong index;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)N,0);
  *pSVar3 = 1.0;
  uVar7 = 0xffffffffffffffff;
  if (-2 < p) {
    uVar7 = (ulong)(p + 1) << 3;
  }
  pdVar4 = (double *)operator_new__(uVar7);
  pvVar5 = operator_new__(uVar7);
  pdVar8 = pdVar4;
  for (uVar7 = 1; pdVar8 = pdVar8 + 1, uVar7 != (~(p >> 0x1f) & p) + 1; uVar7 = uVar7 + 1) {
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)knotU,
                        (long)((i + 1) - (int)uVar7));
    pdVar4[uVar7] = u - *pdVar6;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)knotU,
                        uVar7 + (long)i);
    *(double *)((long)pvVar5 + uVar7 * 8) = *pdVar6 - u;
    dVar10 = 0.0;
    index = 0;
    pdVar9 = pdVar8;
    while (uVar7 != index) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)N,index);
      dVar1 = *pdVar9;
      dVar2 = *(double *)((long)pvVar5 + index * 8 + 8);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar2;
      auVar11._0_8_ = *pSVar3 / (dVar2 + dVar1);
      auVar11._8_8_ = 0;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar10;
      auVar12 = vfmadd231sd_fma(auVar13,auVar11,auVar12);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)N,index);
      pdVar9 = pdVar9 + -1;
      *pSVar3 = auVar12._0_8_;
      dVar10 = auVar11._0_8_ * dVar1;
      index = index + 1;
    }
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)N,uVar7);
    *pSVar3 = dVar10;
  }
  operator_delete__(pdVar4);
  operator_delete__(pvVar5);
  return;
}

Assistant:

static void BasisEvaluate(const int p,                     ///< order
                              const int i,                     ///< knot span, assume aready computed via FindSpan()
                              const double u,                  ///< parameter
                              const ChVectorDynamic<>& knotU,  ///< knot vector
                              ChVectorDynamic<>& N  ///< here return basis functions N evaluated at u, that is: N(u)
    ) {
        N(0) = 1.0;

        int j, r;
        double* left = new double[p + 1];
        double* right = new double[p + 1];
        double saved, temp;

        for (j = 1; j <= p; ++j) {
            left[j] = u - knotU(i + 1 - j);
            right[j] = knotU(i + j) - u;
            saved = 0.0;
            for (r = 0; r < j; ++r) {
                temp = N(r) / (right[r + 1] + left[j - r]);
                N(r) = saved + right[r + 1] * temp;
                saved = left[j - r] * temp;
            }
            N(j) = saved;
        }

        delete[] left;
        delete[] right;
    }